

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> * __thiscall
embree::XMLLoader::loadVec3iArray
          (vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> *__return_storage_ptr__,
          XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  pointer pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  runtime_error *this_01;
  size_t i;
  long lVar7;
  long lVar8;
  allocator local_79;
  vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> *local_78;
  string local_70;
  string local_50;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_70,"ofs",&local_79);
    XML::parm(&local_50,this_00,&local_70);
    bVar2 = std::operator!=(&local_50,"");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    local_78 = __return_storage_ptr__;
    if (bVar2) {
      loadBinary<std::vector<embree::Vec3<int>,std::allocator<embree::Vec3<int>>>>
                (__return_storage_ptr__,this,xml);
      __return_storage_ptr__ = local_78;
    }
    else {
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar6 = ((long)(xml->ptr->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x48;
      if (uVar6 % 3 != 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_70,&xml->ptr->loc);
        std::operator+(&local_50,&local_70,": wrong vector<int3> body");
        std::runtime_error::runtime_error(this_01,(string *)&local_50);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::resize
                (__return_storage_ptr__,uVar6 / 3);
      lVar7 = 8;
      lVar8 = 0x90;
      for (uVar6 = 0; __return_storage_ptr__ = local_78,
          uVar6 < (ulong)(((long)(local_78->
                                 super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_78->
                                super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) / 0xc);
          uVar6 = uVar6 + 1) {
        iVar3 = Token::Int((Token *)((long)&(xml->ptr->body).
                                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-2].ty + lVar8
                                    ));
        iVar4 = Token::Int((Token *)((long)&(xml->ptr->body).
                                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].ty + lVar8
                                    ));
        iVar5 = Token::Int((Token *)((long)&((xml->ptr->body).
                                             super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ty + lVar8)
                          );
        pVVar1 = (local_78->
                 super__Vector_base<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        *(int *)((long)pVVar1 + lVar7 + -8) = iVar3;
        *(int *)((long)pVVar1 + lVar7 + -4) = iVar4;
        *(int *)((long)&pVVar1->field_0 + lVar7) = iVar5;
        lVar7 = lVar7 + 0xc;
        lVar8 = lVar8 + 0xd8;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec3i> XMLLoader::loadVec3iArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<Vec3i>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<Vec3i>>(xml);
    } 
    else 
    {
      std::vector<Vec3i> data;
      if (xml->body.size() % 3 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<int3> body");
      data.resize(xml->body.size()/3);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3i(xml->body[3*i+0].Int(),xml->body[3*i+1].Int(),xml->body[3*i+2].Int());
      return data;
    }
  }